

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

Au_Man_t * Au_ManAlloc(char *pName)

{
  Au_Man_t *pAVar1;
  size_t sVar2;
  char *__dest;
  void **ppvVar3;
  
  pAVar1 = (Au_Man_t *)calloc(1,0x40);
  if (pName == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(pName);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,pName);
  }
  pAVar1->pName = __dest;
  ppvVar3 = (void **)malloc(0x378);
  (pAVar1->vNtks).pArray = ppvVar3;
  (pAVar1->vNtks).nCap = 0x6f;
  (pAVar1->vNtks).nSize = 1;
  *ppvVar3 = (void *)0x0;
  return pAVar1;
}

Assistant:

Au_Man_t * Au_ManAlloc( char * pName )
{
    Au_Man_t * p;
    p = ABC_CALLOC( Au_Man_t, 1 );
    p->pName = Au_UtilStrsav( pName );
    Vec_PtrGrow( &p->vNtks,  111 );
    Vec_PtrPush( &p->vNtks, NULL );
    return p;
}